

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

void __thiscall LiteScript::State::UseNamespace(State *this,char *name)

{
  bool bVar1;
  int iVar2;
  Variable *pVVar3;
  Object *pOVar4;
  Namespace *pNVar5;
  char *pcVar6;
  Type *this_00;
  reference pvVar7;
  undefined1 local_a8 [16];
  undefined1 local_98 [28];
  int index;
  Namespace *tmp;
  uint i;
  uint len;
  Nullable<LiteScript::Variable> v;
  allocator local_39;
  string local_38 [8];
  string nsp;
  char *name_local;
  State *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,name,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"global");
  if (bVar1) {
    pvVar7 = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::back
                       (&this->nsp_lifo);
    Namer::Use(pvVar7,&this->nsp_global);
    v.isNull._0_4_ = 1;
  }
  else {
    Nullable<LiteScript::Variable>::Nullable((Nullable<LiteScript::Variable> *)&i,&this->nsp_global)
    ;
    iVar2 = std::__cxx11::string::size();
    tmp._4_4_ = iVar2 + 1;
    std::__cxx11::string::clear();
    for (tmp._0_4_ = 0; (uint)tmp < tmp._4_4_; tmp._0_4_ = (uint)tmp + 1) {
      if ((name[(uint)tmp] == '.') || (name[(uint)tmp] == '\0')) {
        pVVar3 = Nullable<LiteScript::Variable>::operator*((Nullable<LiteScript::Variable> *)&i);
        pOVar4 = Variable::operator->(pVVar3);
        pNVar5 = Object::GetData<LiteScript::Namespace>(pOVar4);
        unique0x10000350 = pNVar5;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        local_98._20_4_ = Namespace::IndexOf(pNVar5,pcVar6);
        if ((int)local_98._20_4_ < 0) {
          Memory::Create((Memory *)local_98,(Type *)this->memory);
          Nullable<LiteScript::Variable>::operator=
                    ((Nullable<LiteScript::Variable> *)&i,(Variable *)local_98);
          Variable::~Variable((Variable *)local_98);
          pNVar5 = stack0xffffffffffffff80;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          pVVar3 = Nullable<LiteScript::Variable>::operator*((Nullable<LiteScript::Variable> *)&i);
          Namespace::DefineVariable(pNVar5,pcVar6,pVVar3);
        }
        else {
          Namespace::GetVariable((Namespace *)local_a8,(uint)stack0xffffffffffffff80);
          Nullable<LiteScript::Variable>::operator=
                    ((Nullable<LiteScript::Variable> *)&i,(Variable *)local_a8);
          Variable::~Variable((Variable *)local_a8);
          pVVar3 = Nullable<LiteScript::Variable>::operator*((Nullable<LiteScript::Variable> *)&i);
          pOVar4 = Variable::operator->(pVVar3);
          this_00 = Object::GetType(pOVar4);
          bVar1 = Type::operator!=(this_00,(Type *)_type_namespace);
          if (bVar1) {
            UseNamespace(this,"global");
            v.isNull._0_4_ = 1;
            goto LAB_0015de54;
          }
        }
      }
      else {
        std::__cxx11::string::operator+=(local_38,name[(uint)tmp]);
      }
    }
    pvVar7 = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::back
                       (&this->nsp_lifo);
    pVVar3 = Nullable<LiteScript::Variable>::operator*((Nullable<LiteScript::Variable> *)&i);
    Namer::Use(pvVar7,pVVar3);
    v.isNull._0_4_ = 0;
LAB_0015de54:
    Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&i);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void LiteScript::State::UseNamespace(const char *name) {
    std::string nsp(name);
    if (nsp == "global") {
        this->nsp_lifo.back().Use(this->nsp_global);
        return;
    }
    Nullable<Variable> v(this->nsp_global);
    unsigned len = nsp.size() + 1;
    nsp.clear();
    for (unsigned int i = 0; i < len; i++) {
        if (name[i] == '.' || name[i] == '\0') {
            Namespace& tmp = (*v)->GetData<Namespace>();
            int index = tmp.IndexOf(nsp.c_str());
            if (index < 0) {
                v = this->memory.Create(Type::NAMESPACE);
                tmp.DefineVariable(nsp.c_str(), *v);
            }
            else {
                v = tmp.GetVariable((unsigned int)index);
                if ((*v)->GetType() != Type::NAMESPACE) {
                    this->UseNamespace();
                    return;
                }
            }
        }
        else {
            nsp += name[i];
        }
    }
    this->nsp_lifo.back().Use(*v);
}